

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O1

uint32 __thiscall
Js::ByteCodeBufferBuilder::AddConstantTable
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,FunctionBody *function)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  Var var;
  uint32 uVar5;
  RegSlot location;
  
  uVar3 = FunctionBody::GetCountField(function,ConstantCount);
  uVar5 = 0;
  if (2 < uVar3) {
    location = 2;
    uVar5 = 0;
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      var = FunctionBody::GetConstantVar(function,location);
      if (var == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                    ,0x673,"(var != nullptr)","var != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      uVar3 = PrependVarConstant(this,builder,var);
      uVar5 = uVar5 + uVar3;
      location = location + 1;
      uVar3 = FunctionBody::GetCountField(function,ConstantCount);
    } while (location < uVar3);
  }
  return uVar5;
}

Assistant:

uint32 AddConstantTable(BufferBuilderList & builder, FunctionBody * function)
    {
        uint32 size = 0;

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("Start Constant Table"), magicStartOfConstantTable);
#endif

        for (auto reg = FunctionBody::FirstRegSlot + 1; reg < function->GetConstantCount(); reg++) // Ignore first slot, it is always global object or module root object
        {
            auto var = function->GetConstantVar(reg);
            Assert(var != nullptr);
            size += PrependVarConstant(builder, var);
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("End Constant Table"), magicEndOfConstantTable);
#endif

        return size;
    }